

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_value * sqlite3_column_value(sqlite3_stmt *pStmt,int i)

{
  Mem *pMVar1;
  int in_ESI;
  sqlite3_stmt *in_RDI;
  Mem *pOut;
  undefined4 in_stack_fffffffffffffff0;
  
  pMVar1 = columnMem(in_RDI,in_ESI);
  if ((pMVar1->flags & 0x2000) != 0) {
    pMVar1->flags = pMVar1->flags & 0xdfff;
    pMVar1->flags = pMVar1->flags | 0x4000;
  }
  columnMallocFailure((sqlite3_stmt *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  return pMVar1;
}

Assistant:

SQLITE_API sqlite3_value *sqlite3_column_value(sqlite3_stmt *pStmt, int i){
  Mem *pOut = columnMem(pStmt, i);
  if( pOut->flags&MEM_Static ){
    pOut->flags &= ~MEM_Static;
    pOut->flags |= MEM_Ephem;
  }
  columnMallocFailure(pStmt);
  return (sqlite3_value *)pOut;
}